

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  long local_48;
  opj_image_comp_t *l_comp;
  OPJ_UINT32 i;
  OPJ_UINT32 l_comp_def;
  OPJ_UINT32 l_num_comp;
  OPJ_UINT32 l_nb_comp;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  _l_num_comp = p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x19be,
                  "OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x19c0,
                    "OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    i = p_j2k->m_private_image->numcomps;
    if (p_header_size == p_j2k->m_private_image->numcomps + 2) {
      opj_read_bytes_LE(p_header_data,&l_comp_def,2);
      pOStack_20 = pOStack_20 + 2;
      if (l_comp_def == i) {
        local_48 = *(long *)(*(long *)(p_header_data_local + 0x60) + 0x18);
        for (l_comp._0_4_ = 0; (uint)l_comp < i; l_comp._0_4_ = (uint)l_comp + 1) {
          opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_comp + 4),1);
          pOStack_20 = pOStack_20 + 1;
          *(uint *)(local_48 + 0x20) = l_comp._4_4_ >> 7 & 1;
          *(uint *)(local_48 + 0x18) = (l_comp._4_4_ & 0x7f) + 1;
          if (0x1f < *(uint *)(local_48 + 0x18)) {
            opj_event_msg(_l_num_comp,1,
                          "Invalid values for comp = %d : prec=%u (should be between 1 and 38 according to the JPEG2000 norm. OpenJpeg only supports up to 31)\n"
                          ,(ulong)(uint)l_comp,(ulong)*(uint *)(local_48 + 0x18));
            return 0;
          }
          local_48 = local_48 + 0x40;
        }
        p_j2k_local._4_4_ = 1;
      }
      else {
        opj_event_msg(_l_num_comp,1,"Crror reading CBD marker\n");
        p_j2k_local._4_4_ = 0;
      }
    }
    else {
      opj_event_msg(p_manager,1,"Crror reading CBD marker\n");
      p_j2k_local._4_4_ = 0;
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x19bf,
                "OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 l_nb_comp, l_num_comp;
    OPJ_UINT32 l_comp_def;
    OPJ_UINT32 i;
    opj_image_comp_t * l_comp = 00;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_num_comp = p_j2k->m_private_image->numcomps;

    if (p_header_size != (p_j2k->m_private_image->numcomps + 2)) {
        opj_event_msg(p_manager, EVT_ERROR, "Crror reading CBD marker\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_nb_comp,
                   2);                           /* Ncbd */
    p_header_data += 2;

    if (l_nb_comp != l_num_comp) {
        opj_event_msg(p_manager, EVT_ERROR, "Crror reading CBD marker\n");
        return OPJ_FALSE;
    }

    l_comp = p_j2k->m_private_image->comps;
    for (i = 0; i < l_num_comp; ++i) {
        opj_read_bytes(p_header_data, &l_comp_def,
                       1);                  /* Component bit depth */
        ++p_header_data;
        l_comp->sgnd = (l_comp_def >> 7) & 1;
        l_comp->prec = (l_comp_def & 0x7f) + 1;

        if (l_comp->prec > 31) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Invalid values for comp = %d : prec=%u (should be between 1 and 38 according to the JPEG2000 norm. OpenJpeg only supports up to 31)\n",
                          i, l_comp->prec);
            return OPJ_FALSE;
        }
        ++l_comp;
    }

    return OPJ_TRUE;
}